

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitIteratorClose(RegSlot iteratorLocation,ByteCodeGenerator *byteCodeGenerator,
                      FuncInfo *funcInfo,bool isAsync)

{
  RegSlot methodReg;
  ByteCodeLabel noMethodLabel;
  ByteCodeWriter *pBVar1;
  ByteCodeLabel noReturn;
  RegSlot returnReg;
  bool isAsync_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  RegSlot iteratorLocation_local;
  
  methodReg = FuncInfo::AcquireTmpRegister(funcInfo);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  noMethodLabel = Js::ByteCodeWriter::DefineLabel(pBVar1);
  EmitGetOptionalObjectMethod
            (methodReg,iteratorLocation,0x135,noMethodLabel,byteCodeGenerator,funcInfo);
  EmitFunctionCall(methodReg,methodReg,iteratorLocation,byteCodeGenerator,funcInfo);
  if (isAsync) {
    EmitAwait(methodReg,methodReg,byteCodeGenerator,funcInfo);
  }
  EmitThrowOnNotObject(methodReg,byteCodeGenerator);
  FuncInfo::ReleaseTmpRegister(funcInfo,methodReg);
  pBVar1 = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::MarkLabel(pBVar1,noMethodLabel);
  return;
}

Assistant:

void EmitIteratorClose(
    Js::RegSlot iteratorLocation,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    bool isAsync)
{
    Js::RegSlot returnReg = funcInfo->AcquireTmpRegister();
    Js::ByteCodeLabel noReturn = byteCodeGenerator->Writer()->DefineLabel();

    EmitGetOptionalObjectMethod(
        returnReg,
        iteratorLocation,
        Js::PropertyIds::return_,
        noReturn,
        byteCodeGenerator,
        funcInfo);

    EmitFunctionCall(returnReg, returnReg, iteratorLocation, byteCodeGenerator, funcInfo);

    // In for-await or async yield* use await on the returned value
    if (isAsync)
        EmitAwait(returnReg, returnReg, byteCodeGenerator, funcInfo);

    EmitThrowOnNotObject(returnReg, byteCodeGenerator);
    funcInfo->ReleaseTmpRegister(returnReg);
    byteCodeGenerator->Writer()->MarkLabel(noReturn);
}